

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O3

int memleak_posix_memalign(void **memptr,size_t alignment,size_t size,char *file,size_t line)

{
  void *__s;
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = posix_memalign(memptr,alignment,size);
  if ((iVar1 == 0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    __s = *memptr;
    puVar2 = (undefined8 *)malloc(0x38);
    *puVar2 = __s;
    puVar2[1] = file;
    puVar2[3] = line;
    puVar2[2] = size;
    memset(__s,0x77,size);
    avl_insert(&tree_index,(avl_node *)(puVar2 + 4),memleak_cmp);
    pthread_spin_unlock(&lock);
  }
  return iVar1;
}

Assistant:

LIBMEMLEAK_API
int memleak_posix_memalign(void **memptr, size_t alignment, size_t size, char *file, size_t line)
{

    int ret = posix_memalign(memptr, alignment, size);
    if (ret==0 && start_sw)
    {
        spin_lock(&lock);
        _memleak_add_to_index(*memptr, size, file, line, INIT_VAL);
        spin_unlock(&lock);
    }

    return ret;
}